

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ProgramStateCase::verify
          (ProgramStateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  size_t __n;
  int iVar3;
  int extraout_EAX;
  long extraout_RAX;
  long lVar4;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (ctx[0x30] == (EVP_PKEY_CTX)0x0) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Fail, link status may only change as a result of linking or loading a program binary."
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Link status changed");
  }
  lVar4 = *(long *)(ctx + 0x38);
  if (lVar4 != *(long *)(sig + 0x28)) {
    poVar1 = (ostringstream *)(local_1a8 + 8);
    local_1a8._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Fail, reported link time changed.",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Link time changed");
    lVar4 = extraout_RAX;
  }
  __n = *(size_t *)(ctx + 0x18);
  if (__n == *(size_t *)(sig + 8)) {
    if (__n == 0) {
      return (int)lVar4;
    }
    iVar3 = bcmp(*(void **)(ctx + 0x10),*(void **)sig,__n);
    if (iVar3 == 0) {
      return 0;
    }
  }
  poVar1 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Fail, program infolog changed.",0x1e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  tcu::TestContext::setTestResult
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Infolog changed");
  return extraout_EAX;
}

Assistant:

void ProgramStateCase::verify (glu::Program& program, const glu::ProgramInfo& reference)
{
	TestLog&				log			= m_testCtx.getLog();
	const glu::ProgramInfo&	programInfo	= program.getInfo();

	if (!programInfo.linkOk)
	{
		log << TestLog::Message << "Fail, link status may only change as a result of linking or loading a program binary." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Link status changed");
	}

	if (programInfo.linkTimeUs != reference.linkTimeUs)
	{
		log << TestLog::Message << "Fail, reported link time changed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Link time changed");
	}

	if (programInfo.infoLog != reference.infoLog)
	{
		log << TestLog::Message << "Fail, program infolog changed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Infolog changed");
	}
}